

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O2

void g_tree_insert_internal(GTree *tree,gpointer key,gpointer value,gboolean replace)

{
  GDestroyNotify UNRECOVERED_JUMPTABLE;
  char cVar1;
  gint gVar2;
  long lVar3;
  GTreeNode *pGVar4;
  GTreeNode *pGVar5;
  GTreeNode **ppGVar6;
  bool bVar7;
  GTreeNode *path [40];
  
  pGVar5 = tree->root;
  if (pGVar5 == (GTreeNode *)0x0) {
    pGVar5 = g_tree_node_new(key,value);
    tree->root = pGVar5;
    tree->nnodes = tree->nnodes + 1;
  }
  else {
    ppGVar6 = path;
    path[0] = (GTreeNode *)0x0;
    while( true ) {
      gVar2 = (*tree->key_compare)(key,pGVar5->key,tree->key_compare_data);
      if (gVar2 == 0) break;
      if (gVar2 < 0) {
        lVar3 = 0x10;
        if (pGVar5->left_child == '\0') {
          pGVar4 = g_tree_node_new(key,value);
          pGVar4->left = pGVar5->left;
          pGVar4->right = pGVar5;
          pGVar5->left = pGVar4;
          pGVar5->left_child = '\x01';
          cVar1 = -1;
          goto LAB_00499888;
        }
      }
      else {
        lVar3 = 0x18;
        if (pGVar5->right_child == '\0') {
          pGVar4 = g_tree_node_new(key,value);
          pGVar4->right = pGVar5->right;
          pGVar4->left = pGVar5;
          pGVar5->right = pGVar4;
          pGVar5->right_child = '\x01';
          cVar1 = '\x01';
LAB_00499888:
          pGVar5->balance = pGVar5->balance + cVar1;
          tree->nnodes = tree->nnodes + 1;
          goto LAB_0049988f;
        }
      }
      ppGVar6[1] = pGVar5;
      ppGVar6 = ppGVar6 + 1;
      pGVar5 = *(GTreeNode **)((long)&pGVar5->key + lVar3);
    }
    if (tree->value_destroy_func != (GDestroyNotify)0x0) {
      (*tree->value_destroy_func)(pGVar5->value);
    }
    pGVar5->value = value;
    UNRECOVERED_JUMPTABLE = tree->key_destroy_func;
    if (replace == 0) {
      if (UNRECOVERED_JUMPTABLE != (GDestroyNotify)0x0) {
        (*UNRECOVERED_JUMPTABLE)(key);
        return;
      }
    }
    else {
      if (UNRECOVERED_JUMPTABLE != (GDestroyNotify)0x0) {
        (*UNRECOVERED_JUMPTABLE)(pGVar5->key);
      }
      pGVar5->key = key;
    }
  }
  return;
LAB_0049988f:
  pGVar4 = *ppGVar6;
  if (pGVar4 == (GTreeNode *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = pGVar5 == pGVar4->left;
  }
  if ((byte)(pGVar5->balance - 2U) < 0xfd) {
    pGVar5 = g_tree_node_balance(pGVar5);
    if (pGVar4 == (GTreeNode *)0x0) {
      tree->root = pGVar5;
      return;
    }
    if (bVar7) {
      pGVar4->left = pGVar5;
      cVar1 = -1;
      if (pGVar5->balance == '\0') {
        return;
      }
    }
    else {
      pGVar4->right = pGVar5;
      if (pGVar5->balance == '\0') {
        return;
      }
LAB_004998ec:
      cVar1 = '\x01';
    }
  }
  else {
    if (pGVar4 == (GTreeNode *)0x0) {
      return;
    }
    if (pGVar5->balance == '\0') {
      return;
    }
    cVar1 = -1;
    if (!bVar7) goto LAB_004998ec;
  }
  pGVar4->balance = pGVar4->balance + cVar1;
  ppGVar6 = ppGVar6 + -1;
  pGVar5 = pGVar4;
  goto LAB_0049988f;
}

Assistant:

static void g_tree_insert_internal (GTree *tree, gpointer key, gpointer value, gboolean replace)
{
    GTreeNode *node;
    GTreeNode *path[MAX_GTREE_HEIGHT];
    int idx;

    g_return_if_fail (tree != NULL);

    if (!tree->root)
    {
        tree->root = g_tree_node_new (key, value);
        tree->nnodes++;
        return;
    }

    idx = 0;
    path[idx++] = NULL;
    node = tree->root;

    while (1)
    {
        int cmp = tree->key_compare (key, node->key, tree->key_compare_data);

        if (cmp == 0)
        {
            if (tree->value_destroy_func)
                tree->value_destroy_func (node->value);

            node->value = value;

            if (replace)
            {
                if (tree->key_destroy_func)
                    tree->key_destroy_func (node->key);

                node->key = key;
            }
            else
            {
                /* free the passed key */
                if (tree->key_destroy_func)
                    tree->key_destroy_func (key);
            }

            return;
        }
        else if (cmp < 0)
        {
            if (node->left_child)
            {
                path[idx++] = node;
                node = node->left;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->left = node->left;
                child->right = node;
                node->left = child;
                node->left_child = TRUE;
                node->balance -= 1;

                tree->nnodes++;

                break;
            }
        }
        else
        {
            if (node->right_child)
            {
                path[idx++] = node;
                node = node->right;
            }
            else
            {
                GTreeNode *child = g_tree_node_new (key, value);

                child->right = node->right;
                child->left = node;
                node->right = child;
                node->right_child = TRUE;
                node->balance += 1;

                tree->nnodes++;

                break;
            }
        }
    }

    /* Restore balance. This is the goodness of a non-recursive
     * implementation, when we are done with balancing we 'break'
     * the loop and we are done.
     */
    while (1)
    {
        GTreeNode *bparent = path[--idx];
        gboolean left_node = (bparent && node == bparent->left);
        //g_assert (!bparent || bparent->left == node || bparent->right == node);

        if (node->balance < -1 || node->balance > 1)
        {
            node = g_tree_node_balance (node);
            if (bparent == NULL)
                tree->root = node;
            else if (left_node)
                bparent->left = node;
            else
                bparent->right = node;
        }

        if (node->balance == 0 || bparent == NULL)
            break;

        if (left_node)
            bparent->balance -= 1;
        else
            bparent->balance += 1;

        node = bparent;
    }
}